

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_queue_examples.cpp
# Opt level: O0

void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples(void)

{
  ControlBlock **ppCVar1;
  ControlBlock **this;
  bool bVar2;
  bool bVar3;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *pcVar4;
  runtime_type<> *prVar5;
  void *pvVar6;
  int *piVar7;
  ControlBlock *i_address;
  ControlBlock *pCVar8;
  ostream *poVar9;
  byte local_5c9;
  undefined1 local_5c0 [8];
  reentrant_consume_operation consume_13;
  undefined1 local_5a0 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_13;
  int *element_ptr;
  void *unaligned_ptr;
  undefined1 local_550 [7];
  bool is_overaligned;
  reentrant_consume_operation consume_12;
  undefined1 local_530 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_12;
  reentrant_consume_operation consume_11;
  undefined1 local_4d8 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_11;
  undefined1 local_498 [8];
  reentrant_consume_operation consume_10;
  undefined1 local_478 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_10;
  undefined1 local_428 [8];
  reentrant_consume_operation consume_9;
  undefined1 local_408 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_9;
  undefined1 local_3c8 [8];
  reentrant_consume_operation consume_2;
  reentrant_consume_operation consume_1_2;
  undefined1 local_390 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_8;
  reentrant_consume_operation consume_8;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_7;
  undefined1 local_2f0 [8];
  reentrant_consume_operation consume_7;
  undefined1 local_2d0 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_6;
  undefined1 local_280 [8];
  reentrant_consume_operation consume_6;
  undefined1 local_260 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_5;
  undefined1 local_210 [8];
  reentrant_consume_operation consume_5;
  undefined1 local_1f0 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_4;
  int local_19c;
  undefined1 local_198 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_3;
  undefined1 local_148 [8];
  reentrant_consume_operation consume_1_1;
  reentrant_consume_operation consume_4;
  undefined1 local_110 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_2;
  type consume_1;
  reentrant_consume_operation consume_3;
  int local_94;
  undefined1 local_90 [8];
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_1;
  reentrant_consume_operation consume;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&consume.m_consume_operation.m_control);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::reentrant_consume_operation
            ((reentrant_consume_operation *)&queue_1.m_queue.m_tail);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          reentrant_consume_operation::empty((reentrant_consume_operation *)&queue_1.m_queue.m_tail)
  ;
  if (!bVar2) {
    __assert_fail("consume.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x3ec,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)&queue_1.m_queue.m_tail);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&consume.m_consume_operation.m_control);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_90);
  local_94 = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_90,&local_94);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_reentrant_consume
            ((reentrant_consume_operation *)&consume_1.m_consume_operation.m_control,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_90);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::reentrant_consume_operation
            ((reentrant_consume_operation *)&queue_2.m_queue.m_tail,
             (reentrant_consume_operation *)&consume_1.m_consume_operation.m_control);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          reentrant_consume_operation::empty
                    ((reentrant_consume_operation *)&consume_1.m_consume_operation.m_control);
  local_5c9 = 0;
  if (bVar2) {
    bVar2 = density::
            conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_consume_operation::empty
                      ((reentrant_consume_operation *)&queue_2.m_queue.m_tail);
    local_5c9 = bVar2 ^ 0xff;
  }
  if ((local_5c9 & 1) == 0) {
    __assert_fail("consume.empty() && !consume_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x402,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  ppCVar1 = &queue_2.m_queue.m_tail;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::commit((reentrant_consume_operation *)ppCVar1);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation((reentrant_consume_operation *)ppCVar1);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)&consume_1.m_consume_operation.m_control);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_90);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_110);
  consume_4.m_consume_operation.m_control._4_4_ = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_110,(int *)((long)&consume_4.m_consume_operation.m_control + 4));
  consume_4.m_consume_operation.m_control._0_4_ = 0x2b;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_110,(int *)&consume_4.m_consume_operation.m_control);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_reentrant_consume
            ((reentrant_consume_operation *)&consume_1_1.m_consume_operation.m_control,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_110);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::cancel
            ((reentrant_consume_operation *)&consume_1_1.m_consume_operation.m_control);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::reentrant_consume_operation((reentrant_consume_operation *)local_148)
  ;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_reentrant_consume
            ((reentrant_consume_operation *)&queue_3.m_queue.m_tail,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_110);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::operator=
            ((reentrant_consume_operation *)&consume_1_1.m_consume_operation.m_control,
             (reentrant_consume_operation *)&queue_3.m_queue.m_tail);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)&queue_3.m_queue.m_tail);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::operator=
            ((reentrant_consume_operation *)local_148,
             (reentrant_consume_operation *)&consume_1_1.m_consume_operation.m_control);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          reentrant_consume_operation::empty
                    ((reentrant_consume_operation *)&consume_1_1.m_consume_operation.m_control);
  if (!bVar2) {
    __assert_fail("consume.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x412,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          reentrant_consume_operation::empty((reentrant_consume_operation *)local_148);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!consume_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x413,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::commit((reentrant_consume_operation *)local_148);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)local_148);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)&consume_1_1.m_consume_operation.m_control);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_110);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_198);
  local_19c = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_198,&local_19c);
  ppCVar1 = &queue_4.m_queue.m_tail;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_reentrant_consume
            ((reentrant_consume_operation *)ppCVar1,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_198);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation((reentrant_consume_operation *)ppCVar1);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_198);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_1f0);
  consume_5.m_consume_operation.m_control._4_4_ = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_1f0,(int *)((long)&consume_5.m_consume_operation.m_control + 4));
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::reentrant_consume_operation((reentrant_consume_operation *)local_210)
  ;
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          reentrant_consume_operation::empty((reentrant_consume_operation *)local_210);
  if (!bVar2) {
    __assert_fail("consume.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x426,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_reentrant_consume
            ((reentrant_consume_operation *)&queue_5.m_queue.m_tail,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_1f0);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::operator=
            ((reentrant_consume_operation *)local_210,
             (reentrant_consume_operation *)&queue_5.m_queue.m_tail);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)&queue_5.m_queue.m_tail);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          reentrant_consume_operation::empty((reentrant_consume_operation *)local_210);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!consume.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x428,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)local_210);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_1f0);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_260);
  consume_6.m_consume_operation.m_control._4_4_ = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_260,(int *)((long)&consume_6.m_consume_operation.m_control + 4));
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::reentrant_consume_operation((reentrant_consume_operation *)local_280)
  ;
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          reentrant_consume_operation::empty((reentrant_consume_operation *)local_280);
  bVar3 = density::conc_heter_queue::reentrant_consume_operation::operator_cast_to_bool
                    ((reentrant_consume_operation *)local_280);
  if (bVar2 != (bool)((bVar3 ^ 0xffU) & 1)) {
    __assert_fail("consume.empty() == !consume",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x431,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_reentrant_consume
            ((reentrant_consume_operation *)&queue_6.m_queue.m_tail,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_260);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::operator=
            ((reentrant_consume_operation *)local_280,
             (reentrant_consume_operation *)&queue_6.m_queue.m_tail);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)&queue_6.m_queue.m_tail);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          reentrant_consume_operation::empty((reentrant_consume_operation *)local_280);
  bVar3 = density::conc_heter_queue::reentrant_consume_operation::operator_cast_to_bool
                    ((reentrant_consume_operation *)local_280);
  if (bVar2 != (bool)((bVar3 ^ 0xffU) & 1)) {
    __assert_fail("consume.empty() == !consume",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x433,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)local_280);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_260);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_2d0);
  consume_7.m_consume_operation.m_control._4_4_ = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_2d0,(int *)((long)&consume_7.m_consume_operation.m_control + 4));
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::reentrant_consume_operation((reentrant_consume_operation *)local_2f0)
  ;
  bVar3 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          reentrant_consume_operation::empty((reentrant_consume_operation *)local_2f0);
  bVar2 = false;
  if (bVar3) {
    bVar3 = density::conc_heter_queue::reentrant_consume_operation::operator_cast_to_bool
                      ((reentrant_consume_operation *)local_2f0);
    bVar2 = false;
    if (!bVar3) {
      pcVar4 = density::
               conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
               ::reentrant_consume_operation::queue((reentrant_consume_operation *)local_2f0);
      bVar2 = pcVar4 == (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)0x0;
    }
  }
  if (!bVar2) {
    __assert_fail("consume.empty() && !consume && consume.queue() == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x43c,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_reentrant_consume
            ((reentrant_consume_operation *)&queue_7.m_queue.m_tail,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_2d0);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::operator=
            ((reentrant_consume_operation *)local_2f0,
             (reentrant_consume_operation *)&queue_7.m_queue.m_tail);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)&queue_7.m_queue.m_tail);
  bVar3 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          reentrant_consume_operation::empty((reentrant_consume_operation *)local_2f0);
  bVar2 = false;
  if (!bVar3) {
    bVar3 = density::conc_heter_queue::reentrant_consume_operation::operator_cast_to_bool
                      ((reentrant_consume_operation *)local_2f0);
    bVar2 = false;
    if (bVar3) {
      pcVar4 = density::
               conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
               ::reentrant_consume_operation::queue((reentrant_consume_operation *)local_2f0);
      bVar2 = pcVar4 == (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)local_2d0;
    }
  }
  if (!bVar2) {
    __assert_fail("!consume.empty() && !!consume && consume.queue() == &queue",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x43e,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)local_2f0);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_2d0);
  ppCVar1 = &consume_8.m_consume_operation.m_control;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)ppCVar1);
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,char_const(&)[4]>
            ((conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             ppCVar1,(char (*) [4])"abc");
  ppCVar1 = &queue_8.m_queue.m_tail;
  this = &consume_8.m_consume_operation.m_control;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_reentrant_consume
            ((reentrant_consume_operation *)ppCVar1,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)this);
  prVar5 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           reentrant_consume_operation::complete_type((reentrant_consume_operation *)ppCVar1);
  pvVar6 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           reentrant_consume_operation::element_ptr((reentrant_consume_operation *)ppCVar1);
  density::runtime_type<>::destroy(prVar5,pvVar6);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::commit_nodestroy((reentrant_consume_operation *)ppCVar1);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation((reentrant_consume_operation *)ppCVar1);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)this);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_390);
  consume_1_2.m_consume_operation.m_control._4_4_ = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_390,(int *)((long)&consume_1_2.m_consume_operation.m_control + 4));
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_reentrant_consume
            ((reentrant_consume_operation *)&consume_2.m_consume_operation.m_control,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_390);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::reentrant_consume_operation((reentrant_consume_operation *)local_3c8)
  ;
  density::swap((reentrant_consume_operation *)&consume_2.m_consume_operation.m_control,
                (reentrant_consume_operation *)local_3c8);
  prVar5 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           reentrant_consume_operation::complete_type((reentrant_consume_operation *)local_3c8);
  bVar2 = density::runtime_type<>::is<int>(prVar5);
  if (!bVar2) {
    __assert_fail("consume_2.complete_type().is<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x45a,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  prVar5 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           reentrant_consume_operation::complete_type((reentrant_consume_operation *)local_3c8);
  queue_9.m_queue.m_tail = (ControlBlock *)density::runtime_type<>::make<int>();
  bVar2 = density::runtime_type<>::operator==(prVar5,(runtime_type<> *)&queue_9.m_queue.m_tail);
  if (!bVar2) {
    __assert_fail("consume_2.complete_type() == runtime_type<>::make<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x45d,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  piVar7 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           reentrant_consume_operation::element<int>((reentrant_consume_operation *)local_3c8);
  if (*piVar7 != 0x2a) {
    __assert_fail("consume_2.element<int>() == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x45e,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::commit((reentrant_consume_operation *)local_3c8);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)local_390);
  if (!bVar2) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x461,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)local_3c8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)&consume_2.m_consume_operation.m_control);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_390);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_408);
  consume_9.m_consume_operation.m_control._4_4_ = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_408,(int *)((long)&consume_9.m_consume_operation.m_control + 4));
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_reentrant_consume
            ((reentrant_consume_operation *)local_428,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_408);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::cancel((reentrant_consume_operation *)local_428);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_reentrant_consume
            ((reentrant_consume_operation *)&queue_10.m_queue.m_tail,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_408);
  piVar7 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           reentrant_consume_operation::element<int>
                     ((reentrant_consume_operation *)&queue_10.m_queue.m_tail);
  if (*piVar7 != 0x2a) {
    __assert_fail("queue.try_start_reentrant_consume().element<int>() == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x46e,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)&queue_10.m_queue.m_tail);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)local_428);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_408);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_478);
  consume_10.m_consume_operation.m_control._4_4_ = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_478,(int *)((long)&consume_10.m_consume_operation.m_control + 4));
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_reentrant_consume
            ((reentrant_consume_operation *)local_498,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_478);
  prVar5 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           reentrant_consume_operation::complete_type((reentrant_consume_operation *)local_498);
  bVar2 = density::runtime_type<>::is<int>(prVar5);
  if (!bVar2) {
    __assert_fail("consume.complete_type().is<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x478,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  prVar5 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           reentrant_consume_operation::complete_type((reentrant_consume_operation *)local_498);
  queue_11.m_queue.m_tail = (ControlBlock *)density::runtime_type<>::make<int>();
  bVar2 = density::runtime_type<>::operator==(prVar5,(runtime_type<> *)&queue_11.m_queue.m_tail);
  if (!bVar2) {
    __assert_fail("consume.complete_type() == runtime_type<>::make<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x47b,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::commit((reentrant_consume_operation *)local_498);
  bVar2 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)local_478);
  if (!bVar2) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x47e,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)local_498);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_478);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_4d8);
  consume_11.m_consume_operation.m_control._4_4_ = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_4d8,(int *)((long)&consume_11.m_consume_operation.m_control + 4));
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_reentrant_consume
            ((reentrant_consume_operation *)&queue_12.m_queue.m_tail,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_4d8);
  piVar7 = (int *)density::
                  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                  ::reentrant_consume_operation::element_ptr
                            ((reentrant_consume_operation *)&queue_12.m_queue.m_tail);
  *piVar7 = *piVar7 + 1;
  piVar7 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           reentrant_consume_operation::element<int>
                     ((reentrant_consume_operation *)&queue_12.m_queue.m_tail);
  if (*piVar7 != 0x2b) {
    __assert_fail("consume.element<int>() == 43",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x489,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  ppCVar1 = &queue_12.m_queue.m_tail;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::commit((reentrant_consume_operation *)ppCVar1);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation((reentrant_consume_operation *)ppCVar1);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_4d8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_530);
  consume_12.m_consume_operation.m_control._4_4_ = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_530,(int *)((long)&consume_12.m_consume_operation.m_control + 4));
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_reentrant_consume
            ((reentrant_consume_operation *)local_550,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_530);
  i_address = (ControlBlock *)
              density::
              conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              ::reentrant_consume_operation::unaligned_element_ptr
                        ((reentrant_consume_operation *)local_550);
  pCVar8 = (ControlBlock *)
           density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           reentrant_consume_operation::element_ptr((reentrant_consume_operation *)local_550);
  if (i_address != pCVar8) {
    __assert_fail("unaligned_ptr == consume.element_ptr()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x49d,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  queue_13.m_queue.m_tail = i_address;
  bVar2 = density::address_is_aligned(i_address,4);
  if (!bVar2) {
    __assert_fail("address_is_aligned(element_ptr, alignof(int))",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x4a0,
                  "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
                 );
  }
  poVar9 = std::operator<<((ostream *)&std::cout,"An int: ");
  pvVar6 = (void *)std::ostream::operator<<(poVar9,(int)(queue_13.m_queue.m_tail)->m_next);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::commit((reentrant_consume_operation *)local_550);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)local_550);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_530);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_5a0);
  consume_13.m_consume_operation.m_control._4_4_ = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
            )local_5a0,(int *)((long)&consume_13.m_consume_operation.m_control + 4));
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_reentrant_consume
            ((reentrant_consume_operation *)local_5c0,
             (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
              *)local_5a0);
  prVar5 = density::
           conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           reentrant_consume_operation::complete_type((reentrant_consume_operation *)local_5c0);
  bVar2 = density::runtime_type<>::is<int>(prVar5);
  if (bVar2) {
    poVar9 = std::operator<<((ostream *)&std::cout,"An int: ");
    piVar7 = density::
             conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             reentrant_consume_operation::element<int>((reentrant_consume_operation *)local_5c0);
    pvVar6 = (void *)std::ostream::operator<<(poVar9,*piVar7);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_consume_operation::commit((reentrant_consume_operation *)local_5c0);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_consume_operation::~reentrant_consume_operation
              ((reentrant_consume_operation *)local_5c0);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)local_5a0);
    return;
  }
  __assert_fail("consume.complete_type().is<int>()",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                ,0x4ac,
                "void density_tests::conc_heterogeneous_queue_reentrant_consume_operation_samples()"
               );
}

Assistant:

void conc_heterogeneous_queue_reentrant_consume_operation_samples()
    {
        using namespace density;

        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue reentrant_consume_operation default_construct example 1]
            conc_heter_queue<>::reentrant_consume_operation consume;
            assert(consume.empty());
            //! [conc_heter_queue reentrant_consume_operation default_construct example 1]
        }

        //! [conc_heter_queue reentrant_consume_operation copy_construct example 1]
        static_assert(
          !std::is_copy_constructible<conc_heter_queue<>::reentrant_consume_operation>::value, "");
        //! [conc_heter_queue reentrant_consume_operation copy_construct example 1]

        //! [conc_heter_queue reentrant_consume_operation copy_assign example 1]
        static_assert(
          !std::is_copy_assignable<conc_heter_queue<>::reentrant_consume_operation>::value, "");
        //! [conc_heter_queue reentrant_consume_operation copy_assign example 1]

        {
            //! [conc_heter_queue reentrant_consume_operation move_construct example 1]
            conc_heter_queue<> queue;

            queue.push(42);
            auto consume = queue.try_start_reentrant_consume();

            auto consume_1 = std::move(consume);
            assert(consume.empty() && !consume_1.empty());
            consume_1.commit();
            //! [conc_heter_queue reentrant_consume_operation move_construct example 1]
        }
        {
            //! [conc_heter_queue reentrant_consume_operation move_assign example 1]
            conc_heter_queue<> queue;

            queue.push(42);
            queue.push(43);
            auto consume = queue.try_start_reentrant_consume();
            consume.cancel();

            conc_heter_queue<>::reentrant_consume_operation consume_1;
            consume   = queue.try_start_reentrant_consume();
            consume_1 = std::move(consume);
            assert(consume.empty());
            assert(!consume_1.empty());
            consume_1.commit();
            //! [conc_heter_queue reentrant_consume_operation move_assign example 1]
        }
        {
            //! [conc_heter_queue reentrant_consume_operation destroy example 1]
            conc_heter_queue<> queue;
            queue.push(42);

            // this consumed is started and destroyed before being committed, so it has no observable effects
            queue.try_start_reentrant_consume();
            //! [conc_heter_queue reentrant_consume_operation destroy example 1]
        }
        {
            //! [conc_heter_queue reentrant_consume_operation empty example 1]
            conc_heter_queue<> queue;
            queue.push(42);

            conc_heter_queue<>::reentrant_consume_operation consume;
            assert(consume.empty());
            consume = queue.try_start_reentrant_consume();
            assert(!consume.empty());
            //! [conc_heter_queue reentrant_consume_operation empty example 1]
        }
        {
            //! [conc_heter_queue reentrant_consume_operation operator_bool example 1]
            conc_heter_queue<> queue;
            queue.push(42);

            conc_heter_queue<>::reentrant_consume_operation consume;
            assert(consume.empty() == !consume);
            consume = queue.try_start_reentrant_consume();
            assert(consume.empty() == !consume);
            //! [conc_heter_queue reentrant_consume_operation operator_bool example 1]
        }
        {
            //! [conc_heter_queue reentrant_consume_operation queue example 1]
            conc_heter_queue<> queue;
            queue.push(42);

            conc_heter_queue<>::reentrant_consume_operation consume;
            assert(consume.empty() && !consume && consume.queue() == nullptr);
            consume = queue.try_start_reentrant_consume();
            assert(!consume.empty() && !!consume && consume.queue() == &queue);
            //! [conc_heter_queue reentrant_consume_operation queue example 1]
        }
        {
            //! [conc_heter_queue reentrant_consume_operation commit_nodestroy example 1]
            conc_heter_queue<> queue;
            queue.emplace<std::string>("abc");

            conc_heter_queue<>::reentrant_consume_operation consume =
              queue.try_start_reentrant_consume();
            consume.complete_type().destroy(consume.element_ptr());

            // the string has already been destroyed. Calling commit would trigger an undefined behavior
            consume.commit_nodestroy();
            //! [conc_heter_queue reentrant_consume_operation commit_nodestroy example 1]
        }
        {
            //! [conc_heter_queue reentrant_consume_operation swap example 1]
            conc_heter_queue<> queue;
            queue.push(42);

            conc_heter_queue<>::reentrant_consume_operation consume_1 =
              queue.try_start_reentrant_consume();
            conc_heter_queue<>::reentrant_consume_operation consume_2;
            {
                using namespace std;
                swap(consume_1, consume_2);
            }
            assert(consume_2.complete_type().is<int>());
            assert(
              consume_2.complete_type() ==
              runtime_type<>::make<int>()); // same to the previous assert
            assert(consume_2.element<int>() == 42);
            consume_2.commit();

            assert(queue.empty());
            //! [conc_heter_queue reentrant_consume_operation swap example 1]
        }
        {
            //! [conc_heter_queue reentrant_consume_operation cancel example 1]
            conc_heter_queue<> queue;
            queue.push(42);

            conc_heter_queue<>::reentrant_consume_operation consume =
              queue.try_start_reentrant_consume();
            consume.cancel();

            // there is still a 42 in the queue
            assert(queue.try_start_reentrant_consume().element<int>() == 42);
            //! [conc_heter_queue reentrant_consume_operation cancel example 1]
        }
        {
            //! [conc_heter_queue reentrant_consume_operation complete_type example 1]
            conc_heter_queue<> queue;
            queue.push(42);

            conc_heter_queue<>::reentrant_consume_operation consume =
              queue.try_start_reentrant_consume();
            assert(consume.complete_type().is<int>());
            assert(
              consume.complete_type() ==
              runtime_type<>::make<int>()); // same to the previous assert
            consume.commit();

            assert(queue.empty());
            //! [conc_heter_queue reentrant_consume_operation complete_type example 1]
        }
        {
            //! [conc_heter_queue reentrant_consume_operation element_ptr example 1]
            conc_heter_queue<> queue;
            queue.push(42);

            conc_heter_queue<>::reentrant_consume_operation consume =
              queue.try_start_reentrant_consume();
            ++*static_cast<int *>(consume.element_ptr());
            assert(consume.element<int>() == 43);
            consume.commit();
            //! [conc_heter_queue reentrant_consume_operation element_ptr example 1]
        }
        {
            //! [conc_heter_queue reentrant_consume_operation unaligned_element_ptr example 1]
            conc_heter_queue<> queue;
            queue.push(42);

            conc_heter_queue<>::reentrant_consume_operation consume =
              queue.try_start_reentrant_consume();
            bool const   is_overaligned = alignof(int) > conc_heter_queue<>::min_alignment;
            void * const unaligned_ptr  = consume.unaligned_element_ptr();
            int *        element_ptr;
            if (is_overaligned)
            {
                element_ptr = static_cast<int *>(address_upper_align(unaligned_ptr, alignof(int)));
            }
            else
            {
                assert(unaligned_ptr == consume.element_ptr());
                element_ptr = static_cast<int *>(unaligned_ptr);
            }
            assert(address_is_aligned(element_ptr, alignof(int)));
            std::cout << "An int: " << *element_ptr << std::endl;
            consume.commit();
            //! [conc_heter_queue reentrant_consume_operation unaligned_element_ptr example 1]
        }
        {
            //! [conc_heter_queue reentrant_consume_operation element example 1]
            conc_heter_queue<> queue;
            queue.push(42);

            conc_heter_queue<>::reentrant_consume_operation consume =
              queue.try_start_reentrant_consume();
            assert(consume.complete_type().is<int>());
            std::cout << "An int: " << consume.element<int>() << std::endl;
            /* std::cout << "An float: " << consume.element<float>() << std::endl; this would
        trigger an undefined behavior, because the element is not a float */
            consume.commit();
            //! [conc_heter_queue reentrant_consume_operation element example 1]
        }
    }